

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

void fmt::v8::detail::check_int_type_spec<fmt::v8::detail::error_handler&>
               (char spec,error_handler *eh)

{
  int iVar1;
  uint uVar2;
  undefined7 in_register_00000039;
  
  iVar1 = (int)CONCAT71(in_register_00000039,spec);
  uVar2 = iVar1 - 0x42;
  if (((0x36 < uVar2) || ((0x40200700400001U >> ((ulong)uVar2 & 0x3f) & 1) == 0)) && (iVar1 != 0)) {
    error_handler::on_error(eh,"invalid type specifier");
  }
  return;
}

Assistant:

FMT_CONSTEXPR void check_int_type_spec(char spec, ErrorHandler&& eh) {
  switch (spec) {
  case 0:
  case 'd':
  case 'x':
  case 'X':
  case 'b':
  case 'B':
  case 'o':
  case 'c':
    break;
  default:
    eh.on_error("invalid type specifier");
    break;
  }
}